

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::dht_outgoing_get_peers_alert::~dht_outgoing_get_peers_alert
          (dht_outgoing_get_peers_alert *this)

{
  dht_outgoing_get_peers_alert *this_local;
  
  ~dht_outgoing_get_peers_alert(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_outgoing_get_peers_alert final : alert
	{
		// internal
		TORRENT_UNEXPORT dht_outgoing_get_peers_alert(aux::stack_allocator& alloc
			, sha1_hash const& ih, sha1_hash const& obfih
			, udp::endpoint ep);

		TORRENT_DEFINE_ALERT(dht_outgoing_get_peers_alert, 78)

		static inline constexpr alert_category_t static_category = alert_category::dht;
		std::string message() const override;

		// the info_hash of the torrent we're looking for peers for.
		sha1_hash info_hash;

		// if this was an obfuscated lookup, this is the info-hash target
		// actually sent to the node.
		sha1_hash obfuscated_info_hash;

		// the endpoint we're sending this query to
		aux::noexcept_movable<udp::endpoint> endpoint;

#if TORRENT_ABI_VERSION == 1
		// the endpoint we're sending this query to
		TORRENT_DEPRECATED aux::noexcept_movable<udp::endpoint> ip;
#endif
	}